

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Jsrt.cpp
# Opt level: O3

JsErrorCode JsPrivateFreeDetachedArrayBuffer(void *detachedState)

{
  ArrayBufferDetachedStateBase *state;
  AutoNestedHandledExceptionType local_38 [2];
  TTDebuggerAbortException anon_var_0;
  
  AutoNestedHandledExceptionType::AutoNestedHandledExceptionType
            (local_38,ExceptionType_StackOverflow|ExceptionType_OutOfMemory);
  if (*(char *)((long)detachedState + 0xc) == '\0') {
    (**(code **)(*detachedState + 0x18))(detachedState);
  }
  (**(code **)(*detachedState + 0x10))(detachedState);
  AutoNestedHandledExceptionType::~AutoNestedHandledExceptionType(local_38);
  return JsNoError;
}

Assistant:

CHAKRA_API JsPrivateFreeDetachedArrayBuffer(_In_ void* detachedState)
{
    return GlobalAPIWrapper_NoRecord([&]() -> JsErrorCode
    {
        auto state = reinterpret_cast<Js::ArrayBufferDetachedStateBase*>(detachedState);
        state->CleanUp();
        return JsNoError;
    });
}